

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

bool __thiscall
TPathFragmentTable::ComparePathFragment
          (TPathFragmentTable *this,TMndxSearch *pSearch,size_t nFragmentOffset)

{
  TStruct40 *pTVar1;
  bool bVar2;
  char *pcVar3;
  
  pTVar1 = pSearch->pStruct40;
  if ((this->PathMarks).TotalItemCount == 0) {
    do {
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,nFragmentOffset);
      if (*pcVar3 != pSearch->szSearchMask[pTVar1->PathLength]) {
        return false;
      }
      pTVar1->PathLength = pTVar1->PathLength + 1;
      nFragmentOffset = nFragmentOffset + 1;
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,nFragmentOffset);
      if (*pcVar3 == '\0') {
        return true;
      }
    } while ((ulong)pTVar1->PathLength < pSearch->cchSearchMask);
  }
  else {
    do {
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,nFragmentOffset);
      if (*pcVar3 != pSearch->szSearchMask[pTVar1->PathLength]) {
        return false;
      }
      pTVar1->PathLength = pTVar1->PathLength + 1;
      bVar2 = TSparseArray::IsItemPresent(&this->PathMarks,nFragmentOffset);
      if (bVar2) {
        return true;
      }
      nFragmentOffset = nFragmentOffset + 1;
    } while (nFragmentOffset < pSearch->cchSearchMask);
  }
  return false;
}

Assistant:

bool ComparePathFragment(TMndxSearch * pSearch, size_t nFragmentOffset)
    {
        TStruct40 * pStruct40 = pSearch->pStruct40;

        // Do we have path fragment separators in an external structure?
        if(PathMarks.IsEmpty())
        {
            // Keep searching as long as the name matches with the fragment
            while(PathFragments[nFragmentOffset] == pSearch->szSearchMask[pStruct40->PathLength])
            {
                // Move to the next character
                pStruct40->PathLength++;
                nFragmentOffset++;

                // Is it the end of the fragment or end of the path?
                if(PathFragments[nFragmentOffset] == 0)
                    return true;
                if(pStruct40->PathLength >= pSearch->cchSearchMask)
                    return false;
            }

            return false;
        }
        else
        {
            // Keep searching as long as the name matches with the fragment
            while(PathFragments[nFragmentOffset] == pSearch->szSearchMask[pStruct40->PathLength])
            {
                // Move to the next character
                pStruct40->PathLength++;

                // Is it the end of the path fragment?
                if(PathMarks.IsItemPresent(nFragmentOffset++))
                    return true;
                if(nFragmentOffset >= pSearch->cchSearchMask)
                    return false;
            }

            return false;
        }
    }